

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O2

mpt_reply_context_detached * contextDefer(mpt_reply_context *ptr)

{
  uintptr_t uVar1;
  ulong uVar2;
  mpt_reply_context_detached *pmVar3;
  long lVar4;
  
  if (*(short *)((long)&ptr[1]._vptr + 2) != 0) {
    uVar1 = mpt_refcount_raise((mpt_refcount *)(ptr + -2));
    if (uVar1 != 0) {
      uVar2 = (ulong)*(ushort *)&ptr[1]._vptr;
      lVar4 = 0;
      if (3 < uVar2) {
        lVar4 = uVar2 - 4;
      }
      pmVar3 = (mpt_reply_context_detached *)malloc(lVar4 + 0x18);
      if (pmVar3 != (mpt_reply_context_detached *)0x0) {
        pmVar3->_vptr = &contextDefer::deferCtx;
        memcpy(pmVar3 + 2,ptr + 1,lVar4 + 8);
        pmVar3[1]._vptr = (_mpt_vptr_reply_context_detached *)(ptr + -4);
        *(undefined2 *)((long)&ptr[1]._vptr + 2) = 0;
        return pmVar3;
      }
      mpt_refcount_lower((mpt_refcount *)(ptr + -2));
    }
  }
  return (mpt_reply_context_detached *)0x0;
}

Assistant:

static MPT_INTERFACE(reply_context_detached) *contextDefer(MPT_STRUCT(reply_context) *ptr)
{
	static const MPT_INTERFACE_VPTR(reply_context_detached) deferCtx = {
		deferReply
	};
	MPT_STRUCT(reply_context_defer) *ctx = MPT_baseaddr(reply_context_defer, ptr, _ctx);
	struct replyDataDelayed *def;
	size_t post;
	
	if (!ctx->data.len) {
		return 0;
	}
	if (!mpt_refcount_raise(&ctx->ref)) {
		return 0;
	}
	if ((post = ctx->data._max) < sizeof(ctx->data.val)) {
		post = 0;
	} else {
		post -= sizeof(ctx->data.val);
	}
	if (!(def = malloc(sizeof(*def) + post))) {
		mpt_refcount_lower(&ctx->ref);
		return 0;
	}
	def->_rc._vptr = &deferCtx;
	memcpy(&def->data, &ctx->data, sizeof(def->data) + post);
	def->base = ctx;
	
	/* reply data belongs to new context */
	ctx->data.len = 0;
	
	return &def->_rc;
}